

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasMapFields(Descriptor *descriptor)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Descriptor *in_RDI;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int index;
  
  iVar4 = 0;
  while( true ) {
    index = iVar4;
    iVar2 = Descriptor::field_count(in_RDI);
    if (iVar2 <= iVar4) {
      iVar4 = 0;
      while( true ) {
        iVar2 = iVar4;
        iVar3 = Descriptor::nested_type_count(in_RDI);
        if (iVar3 <= iVar4) {
          return false;
        }
        Descriptor::nested_type(in_RDI,iVar2);
        bVar1 = HasMapFields((Descriptor *)CONCAT44(index,iVar2));
        if (bVar1) break;
        iVar4 = iVar2 + 1;
      }
      return true;
    }
    Descriptor::field(in_RDI,index);
    bVar1 = FieldDescriptor::is_map((FieldDescriptor *)CONCAT44(iVar4,in_stack_ffffffffffffffe0));
    if (bVar1) break;
    iVar4 = index + 1;
  }
  return true;
}

Assistant:

static bool HasMapFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (descriptor->field(i)->is_map()) {
      return true;
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasMapFields(descriptor->nested_type(i))) return true;
  }
  return false;
}